

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

Atlas * xatlas::Create(void)

{
  Atlas *__s;
  TaskScheduler *this;
  
  __s = (Atlas *)(*(code *)internal::s_realloc)(0);
  if (__s != (Atlas *)0x0) {
    memset(__s,0,0x110);
    *(undefined4 *)&__s[1].meshes = 0xffffffff;
    __s[1].utilization = (float *)0x0;
    __s[1].width = 8;
    __s[1].height = 0;
    __s[1].atlasCount = 0;
    __s[1].meshCount = 0;
    __s[1].texelsPerUnit = 0.0;
    __s[2].image = (uint32_t *)0x48;
    *(undefined4 *)&__s[2].meshes = 0;
    __s[2].utilization = (float *)0x0;
    __s[2].width = 0x18;
    __s[2].height = 0;
    __s[2].atlasCount = 0;
    *(undefined1 *)&__s[2].meshCount = 0;
    __s[3].width = 0;
    __s[3].height = 0;
    __s[3].image = (uint32_t *)0x0;
    __s[3].meshes = (Mesh *)0x0;
    __s[3].atlasCount = 8;
    __s[3].chartCount = 0;
    __s[3].meshCount = 0;
    __s[4].image = (uint32_t *)0x0;
    __s[4].meshes = (Mesh *)0x8;
    *(undefined4 *)&__s[4].utilization = 0;
    __s[4].width = 0;
    __s[4].height = 0;
    __s[4].atlasCount = 8;
    __s[4].chartCount = 0;
    __s[4].meshCount = 0;
    __s[5].image = (uint32_t *)0x0;
    __s[5].meshes = (Mesh *)0x8;
    *(undefined4 *)&__s[5].utilization = 0;
    *(undefined1 *)&__s[5].width = 0;
    __s->atlasCount = 0;
    __s->chartCount = 0;
    __s->meshCount = 0;
    __s->texelsPerUnit = 0.0;
    __s->utilization = (float *)0x0;
    __s->width = 0;
    __s->height = 0;
    __s->image = (uint32_t *)0x0;
    __s->meshes = (Mesh *)0x0;
    this = (TaskScheduler *)(*(code *)internal::s_realloc)(0,0x28);
    if (this != (TaskScheduler *)0x0) {
      internal::TaskScheduler::TaskScheduler(this);
      __s[3].utilization = (float *)this;
      return __s;
    }
  }
  __assert_fail("size <= 0 || (size > 0 && mem)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,0x1ae,"void *xatlas::internal::Realloc(void *, size_t, int, const char *, int)");
}

Assistant:

Atlas *Create()
{
	Context *ctx = XA_NEW(internal::MemTag::Default, Context);
	memset(&ctx->atlas, 0, sizeof(Atlas));
	ctx->taskScheduler = XA_NEW(internal::MemTag::Default, internal::TaskScheduler);
	return &ctx->atlas;
}